

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::
Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>::
operator+=(Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
           *this,LoopItem *item)

{
  SizeT SVar1;
  SizeT SVar2;
  LoopItem *pLVar3;
  LoopItem *value;
  LoopItem *item_local;
  Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
  *this_local;
  
  SVar1 = Size(this);
  SVar2 = Capacity(this);
  if (SVar1 == SVar2) {
    SVar1 = Capacity(this);
    SVar2 = Capacity(this);
    resize(this,(SVar1 | SVar2 == 0) << 1);
  }
  pLVar3 = Storage(this);
  SVar1 = Size(this);
  value = Memory::
          Move<Qentem::TemplateCore<char,Qentem::Value<char>,Qentem::StringStream<char>>::LoopItem>
                    (item);
  Memory::
  Initialize<Qentem::TemplateCore<char,Qentem::Value<char>,Qentem::StringStream<char>>::LoopItem>
            (pLVar3 + SVar1,value);
  this->index_ = this->index_ + 1;
  return;
}

Assistant:

void operator+=(Type_T &&item) {
        if (Size() == Capacity()) {
            resize((Capacity() | (Capacity() == 0)) * SizeT{2});
        }

        Memory::Initialize((Storage() + Size()), Memory::Move(item));
        ++index_;
    }